

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_ObjPrintVerbose(Aig_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x28f,"void Aig_ObjPrintVerbose(Aig_Obj_t *, int)");
  }
  printf("Node %d : ",(ulong)(uint)pObj->Id);
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (uVar1 == 3) {
    printf("CO( ");
    pcVar2 = "\'";
    if (((ulong)pObj->pFanin0 & 1) == 0) {
      pcVar2 = " ";
    }
    printf("%d%s )",(ulong)*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24),pcVar2);
  }
  else {
    if (uVar1 == 2) {
      pcVar2 = "CI";
    }
    else {
      if (uVar1 != 1) {
        pcVar3 = "\'";
        pcVar2 = "\'";
        if (((ulong)pObj->pFanin0 & 1) == 0) {
          pcVar2 = " ";
        }
        if (((ulong)pObj->pFanin1 & 1) == 0) {
          pcVar3 = " ";
        }
        printf("AND( %d%s, %d%s )",
               (ulong)*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24),pcVar2,
               (ulong)*(uint *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24),pcVar3);
        goto LAB_006d3977;
      }
      pcVar2 = "constant 1";
    }
    printf(pcVar2);
  }
LAB_006d3977:
  printf(" (refs = %3d)",(ulong)(*(uint *)&pObj->field_0x18 >> 6));
  return;
}

Assistant:

void Aig_ObjPrintVerbose( Aig_Obj_t * pObj, int fHaig )
{
    assert( !Aig_IsComplement(pObj) );
    printf( "Node %d : ", pObj->Id );
    if ( Aig_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Aig_ObjIsCi(pObj) )
        printf( "CI" );
    else if ( Aig_ObjIsCo(pObj) )
    {
        printf( "CO( " );
        printf( "%d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    }
    else
        printf( "AND( %d%s, %d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " "), 
            Aig_ObjFanin1(pObj)->Id, (Aig_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Aig_ObjRefs(pObj) );
}